

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  path *this_00;
  bool bVar1;
  long lVar2;
  format fmt;
  string_type local_80;
  iterator iter;
  
  bVar1 = has_relative_path(this);
  if (bVar1) {
    end(&iter,this);
    iterator::operator--(&iter);
    this_00 = &iter._current;
    lVar2 = std::__cxx11::string::rfind((char)this_00,0x2e);
    if (1 < lVar2 + 1U) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)this_00);
      path(__return_storage_ptr__,&local_80,fmt);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)this_00);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::extension() const
{
    if (has_relative_path()) {
        auto iter = end();
        const auto& fn = *--iter;
        impl_string_type::size_type pos = fn._path.rfind('.');
        if (pos != std::string::npos && pos > 0) {
            return path(fn._path.substr(pos), native_format);
        }
    }
    return path();
}